

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O3

uint64_t __thiscall wasm::Literal::getUnsigned(Literal *this)

{
  ulong uVar1;
  int iVar2;
  uint64_t uVar3;
  
  uVar1 = (this->type).id;
  if (6 < uVar1) {
    __assert_fail("isBasic() && \"Basic type expected\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                  ,0x1c4,"BasicType wasm::Type::getBasic() const");
  }
  iVar2 = (int)uVar1;
  if (iVar2 == 3) {
    uVar3 = (this->field_0).i64;
  }
  else {
    if (iVar2 != 2) {
      abort();
    }
    uVar3 = (uint64_t)(uint)(this->field_0).i32;
  }
  return uVar3;
}

Assistant:

uint64_t Literal::getUnsigned() const {
  switch (type.getBasic()) {
    case Type::i32:
      return static_cast<uint32_t>(i32);
    case Type::i64:
      return i64;
    default:
      abort();
  }
}